

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

Animation __thiscall
DataSourceBase::get_animation(DataSourceBase *this,size_t animation,size_t phase)

{
  Animation AVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  Stream *pSVar5;
  reference pvVar6;
  size_type local_78 [3];
  allocator<char> local_59;
  string local_58 [32];
  Stream local_38;
  ulong local_30;
  size_t phase_local;
  size_t animation_local;
  DataSourceBase *this_local;
  undefined4 uStack_10;
  undefined4 local_c;
  
  local_30 = phase >> 3;
  phase_local = animation;
  animation_local = (size_t)this;
  sVar3 = std::
          vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
          ::size(&this->animation_table);
  uVar2 = local_30;
  if (animation < sVar3) {
    pvVar4 = std::
             vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
             ::operator[](&this->animation_table,phase_local);
    sVar3 = std::vector<Data::Animation,_std::allocator<Data::Animation>_>::size(pvVar4);
    if (uVar2 < sVar3) {
      pvVar4 = std::
               vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
               ::operator[](&this->animation_table,phase_local);
      pvVar6 = std::vector<Data::Animation,_std::allocator<Data::Animation>_>::operator[]
                         (pvVar4,local_30);
      this_local._4_1_ = pvVar6->sprite;
      this_local._5_3_ = *(undefined3 *)&pvVar6->field_0x1;
      uStack_10 = pvVar6->x;
      local_c = pvVar6->y;
      goto LAB_0016ac5c;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"data",&local_59);
  Log::Logger::operator[]((Logger *)&local_38,(string *)&Log::Error);
  pSVar5 = Log::Stream::operator<<(&local_38,"Failed to get animation #");
  pSVar5 = Log::Stream::operator<<(pSVar5,&phase_local);
  pSVar5 = Log::Stream::operator<<(pSVar5," phase #");
  pSVar5 = Log::Stream::operator<<(pSVar5,&local_30);
  pSVar5 = Log::Stream::operator<<(pSVar5," (got only ");
  pvVar4 = std::
           vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
           ::operator[](&this->animation_table,phase_local);
  local_78[0] = std::vector<Data::Animation,_std::allocator<Data::Animation>_>::size(pvVar4);
  pSVar5 = Log::Stream::operator<<(pSVar5,local_78);
  Log::Stream::operator<<(pSVar5," phases)");
  Log::Stream::~Stream(&local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  stack0xffffffffffffffec = ((ulong)stack0xffffffffffffffec >> 8 & 0xffffff) << 8;
  local_c = 0;
LAB_0016ac5c:
  AVar1.y = local_c;
  AVar1.sprite = this_local._4_1_;
  AVar1._1_3_ = this_local._5_3_;
  AVar1.x = uStack_10;
  return AVar1;
}

Assistant:

Data::Animation
DataSourceBase::get_animation(size_t animation, size_t phase) {
  phase >>= 3;
  if ((animation >= animation_table.size()) ||
      (phase >= animation_table[animation].size())) {
    Log::Error["data"] << "Failed to get animation #" << animation
    << " phase #" << phase
    << " (got only " << animation_table[animation].size()
    << " phases)";
    return {0, 0, 0};
  }

  return animation_table[animation][phase];
}